

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O0

void sw_via_0(ubyte iobyte)

{
  byte local_9;
  ubyte iobyte_local;
  
  s_via_opb = iobyte & s_via[2];
  local_9 = iobyte;
  if (iobyte == '\0') {
    local_9 = 0;
  }
  current_latch = s_via_opb;
  s_via[0] = iobyte;
  s_via_latch[(int)(s_via_opb & 7)] = s_via_opb & 8;
  local_9 = local_9 & 7;
  if (((local_9 == 4) || (local_9 == 5)) && (teletext == '\0')) {
    set_screen_start();
  }
  if (local_9 == 0) {
    sound_byte(s_via_opa);
  }
  return;
}

Assistant:

void sw_via_0(ubyte iobyte) {
    s_via[ORB] = iobyte;
    current_latch = s_via_opb = iobyte & s_via[DDRB];
    if (iobyte == 0)
        iobyte = 0;
    s_via_latch[s_via_opb & 7] = s_via_opb & 8;

    iobyte &= 7;
    if ((iobyte == 4) || (iobyte == 5)) if (!teletext) set_screen_start();
    if (iobyte == 0) sound_byte(s_via_opa);
}